

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O1

int __thiscall glslang::TInputScanner::get(TInputScanner *this)

{
  int *piVar1;
  TSourceLoc *pTVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  size_t sVar6;
  
  lVar3 = (long)this->currentSource;
  if (this->currentSource < this->numSources) {
    sVar6 = this->currentChar;
    lVar5 = lVar3;
    do {
      if (sVar6 < this->lengths[lVar5]) {
        uVar4 = (uint)this->sources[lVar5][sVar6];
        goto LAB_0037dad4;
      }
      lVar5 = lVar5 + 1;
      sVar6 = 0;
    } while (this->numSources != lVar5);
  }
  else {
    this->endOfFileReached = true;
  }
  uVar4 = 0xffffffff;
LAB_0037dad4:
  if (uVar4 != 0xffffffff) {
    pTVar2 = this->loc;
    pTVar2[lVar3].column = pTVar2[lVar3].column + 1;
    piVar1 = &(this->logicalSourceLoc).column;
    *piVar1 = *piVar1 + 1;
    if (uVar4 == 10) {
      pTVar2[lVar3].line = pTVar2[lVar3].line + 1;
      piVar1 = &(this->logicalSourceLoc).line;
      *piVar1 = *piVar1 + 1;
      (this->logicalSourceLoc).column = 0;
      pTVar2[lVar3].column = 0;
    }
    advance(this);
  }
  return uVar4;
}

Assistant:

int peek()
    {
        if (currentSource >= numSources) {
            endOfFileReached = true;
            return EndOfInput;
        }
        // Make sure we do not read off the end of a string.
        // N.B. Sources can have a length of 0.
        int sourceToRead = currentSource;
        size_t charToRead = currentChar;
        while(charToRead >= lengths[sourceToRead]) {
            charToRead = 0;
            sourceToRead += 1;
            if (sourceToRead >= numSources) {
                return EndOfInput;
            }
        }

        // Here, we care about making negative valued characters positive
        return sources[sourceToRead][charToRead];
    }